

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O1

void __thiscall imrt::Collimator::insertXorder(Collimator *this,double x)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  iterator __position;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  double local_30;
  
  local_30 = x;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_equals_val<double_const>>
                    ((this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  pdVar2 = (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar5 = _Var1._M_current != __position._M_current;
  if (__position._M_current != pdVar2 && !bVar5) {
    bVar5 = _Var1._M_current != __position._M_current;
    uVar3 = 1;
    lVar4 = 0;
    do {
      if (local_30 < *(double *)((long)pdVar2 + lVar4)) {
        std::vector<double,_std::allocator<double>_>::insert
                  (&this->xcoord,(const_iterator)(pdVar2 + lVar4),&local_30);
        bVar5 = true;
      }
      pdVar2 = (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if ((ulong)((long)__position._M_current - (long)pdVar2 >> 3) <= uVar3) break;
      lVar4 = lVar4 + 8;
      uVar3 = uVar3 + 1;
    } while (!bVar5);
  }
  if (!bVar5) {
    if (__position._M_current ==
        (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->xcoord,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      (this->xcoord).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void Collimator::insertXorder(double x) {
    bool flag=false;
    if (find(xcoord.begin(), xcoord.end(), x) != xcoord.end())
      flag=true;
    for (int j=0; j< xcoord.size() && !flag; j++) {
      if (xcoord[j] > x) {
        xcoord.insert(xcoord.begin()+j, x);
        flag=true;
      }
    }
    if (!flag) xcoord.push_back(x);
  }